

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall Units::setUnits(Units *this,Options *options)

{
  int value;
  
  value = setFlowFactor(this,options->indexOptions[1]);
  Options::setOption(options,UNIT_SYSTEM,value);
  setPressureFactor(this,value,options);
  setOtherFactors(this,value);
  return;
}

Assistant:

void Units::setUnits(Options &options)
{
    // ... flow units determines flow conversion factor and units system

    int unitSystem = setFlowFactor(options.flowUnits());
    options.setOption(Options::UNIT_SYSTEM, unitSystem);

    // ... assign pressure conversion factor

    setPressureFactor(unitSystem, options);

    // ... assign conversion factors for other quantities

    setOtherFactors(unitSystem);
}